

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2435f::TestStreamingFloatWritesCorrectCharacters::RunImpl
          (TestStreamingFloatWritesCorrectCharacters *this)

{
  TestResults *this_00;
  char *pcVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_1c0;
  MemoryOutStream stream;
  
  UnitTest::MemoryOutStream::MemoryOutStream(&stream);
  std::ostream::_M_insert<double>(3.1414999961853027);
  pcVar1 = UnitTest::MemoryOutStream::GetText(&stream);
  pcVar1 = strstr(pcVar1,"3.1415");
  if (pcVar1 == (char *)0x0) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1c0,*ppTVar3,0x40);
    UnitTest::TestResults::OnTestFailure(this_00,&local_1c0,"strstr(stream.GetText(), \"3.1415\")");
  }
  UnitTest::MemoryOutStream::~MemoryOutStream(&stream);
  return;
}

Assistant:

TEST(StreamingFloatWritesCorrectCharacters)
{
    MemoryOutStream stream;
    stream << 3.1415f;
	CHECK(strstr(stream.GetText(), "3.1415"));
}